

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O3

void nng_http_transact(nng_http *conn,nng_aio *aio)

{
  nni_http_transact_conn(conn,aio);
  return;
}

Assistant:

void
nng_http_transact(nng_http *conn, nng_aio *aio)
{
#ifdef NNG_SUPP_HTTP
	nni_http_transact_conn(conn, aio);
#else
	NNI_ARG_UNUSED(conn);
	nni_aio_finish_error(aio, NNG_ENOTSUP);
#endif
}